

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

int GetMapIndex(char *mapname,int lastindex,char *lumpname,bool needrequired)

{
  int iVar1;
  ulong local_38;
  size_t i;
  char *pcStack_28;
  bool needrequired_local;
  char *lumpname_local;
  int lastindex_local;
  char *mapname_local;
  
  pcStack_28 = lumpname;
  if (lumpname == (char *)0x0) {
    pcStack_28 = "";
  }
  local_38 = (ulong)(lastindex + 1);
  while( true ) {
    if (0xb < local_38) {
      return -1;
    }
    iVar1 = strncasecmp(pcStack_28,GetMapIndex::check[local_38].lumpname,8);
    if (iVar1 == 0) break;
    if ((GetMapIndex::check[local_38].required & 1U) != 0) {
      if (needrequired) {
        I_Error("\'%s\' not found in %s\n",GetMapIndex::check + local_38,mapname);
      }
      return -2;
    }
    local_38 = local_38 + 1;
  }
  return (int)local_38;
}

Assistant:

static int GetMapIndex(const char *mapname, int lastindex, const char *lumpname, bool needrequired)
{
	static const checkstruct check[] = 
	{
		{"",		 true},
		{"THINGS",	 true},
		{"LINEDEFS", true},
		{"SIDEDEFS", true},
		{"VERTEXES", true},
		{"SEGS",	 false},
		{"SSECTORS", false},
		{"NODES",	 false},
		{"SECTORS",	 true},
		{"REJECT",	 false},
		{"BLOCKMAP", false},
		{"BEHAVIOR", false},
		//{"SCRIPTS",	 false},
	};

	if (lumpname==NULL) lumpname="";

	for(size_t i=lastindex+1;i<countof(check);i++)
	{
		if (!strnicmp(lumpname, check[i].lumpname, 8))
			return (int)i;

		if (check[i].required)
		{
			if (needrequired)
			{
				I_Error("'%s' not found in %s\n", check[i].lumpname, mapname);
			}
			return -2;
		}
	}

	return -1;	// End of map reached
}